

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

void xml_end(void *userData,char *name)

{
  xar *xar_00;
  xar_file *pxVar1;
  int iVar2;
  xar *xar;
  archive_read *a;
  char *name_local;
  void *userData_local;
  
  xar_00 = (xar *)**(undefined8 **)((long)userData + 0x818);
  switch(xar_00->xmlsts) {
  case INIT:
    break;
  case XAR:
    iVar2 = strcmp(name,"xar");
    if (iVar2 == 0) {
      xar_00->xmlsts = INIT;
    }
    break;
  case TOC:
    iVar2 = strcmp(name,"toc");
    if (iVar2 == 0) {
      xar_00->xmlsts = XAR;
    }
    break;
  case TOC_CREATION_TIME:
    iVar2 = strcmp(name,"creation-time");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC;
    }
    break;
  case TOC_CHECKSUM:
    iVar2 = strcmp(name,"checksum");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC;
    }
    break;
  case TOC_CHECKSUM_OFFSET:
    iVar2 = strcmp(name,"offset");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_CHECKSUM;
    }
    break;
  case TOC_CHECKSUM_SIZE:
    iVar2 = strcmp(name,"size");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_CHECKSUM;
    }
    break;
  case TOC_FILE:
    iVar2 = strcmp(name,"file");
    if (iVar2 == 0) {
      if ((xar_00->file->parent != (xar_file *)0x0) && ((xar_00->file->mode & 0xf000) == 0x4000)) {
        pxVar1 = xar_00->file->parent;
        pxVar1->subdirs = pxVar1->subdirs + 1;
      }
      xar_00->file = xar_00->file->parent;
      if (xar_00->file == (xar_file *)0x0) {
        xar_00->xmlsts = TOC;
      }
    }
    break;
  case FILE_DATA:
    iVar2 = strcmp(name,"data");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_DATA_LENGTH:
    iVar2 = strcmp(name,"length");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DATA;
    }
    break;
  case FILE_DATA_OFFSET:
    iVar2 = strcmp(name,"offset");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DATA;
    }
    break;
  case FILE_DATA_SIZE:
    iVar2 = strcmp(name,"size");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DATA;
    }
    break;
  case FILE_DATA_ENCODING:
    iVar2 = strcmp(name,"encoding");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DATA;
    }
    break;
  case FILE_DATA_A_CHECKSUM:
    iVar2 = strcmp(name,"archived-checksum");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DATA;
    }
    break;
  case FILE_DATA_E_CHECKSUM:
    iVar2 = strcmp(name,"extracted-checksum");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DATA;
    }
    break;
  case FILE_DATA_CONTENT:
    iVar2 = strcmp(name,"content");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DATA;
    }
    break;
  case FILE_EA:
    iVar2 = strcmp(name,"ea");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
      xar_00->xattr = (xattr *)0x0;
    }
    break;
  case FILE_EA_LENGTH:
    iVar2 = strcmp(name,"length");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_EA_OFFSET:
    iVar2 = strcmp(name,"offset");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_EA_SIZE:
    iVar2 = strcmp(name,"size");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_EA_ENCODING:
    iVar2 = strcmp(name,"encoding");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_EA_A_CHECKSUM:
    iVar2 = strcmp(name,"archived-checksum");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_EA_E_CHECKSUM:
    iVar2 = strcmp(name,"extracted-checksum");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_EA_NAME:
    iVar2 = strcmp(name,"name");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_EA_FSTYPE:
    iVar2 = strcmp(name,"fstype");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EA;
    }
    break;
  case FILE_CTIME:
    iVar2 = strcmp(name,"ctime");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_MTIME:
    iVar2 = strcmp(name,"mtime");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_ATIME:
    iVar2 = strcmp(name,"atime");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_GROUP:
    iVar2 = strcmp(name,"group");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_GID:
    iVar2 = strcmp(name,"gid");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_USER:
    iVar2 = strcmp(name,"user");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_UID:
    iVar2 = strcmp(name,"uid");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_MODE:
    iVar2 = strcmp(name,"mode");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_DEVICE:
    iVar2 = strcmp(name,"device");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_DEVICE_MAJOR:
    iVar2 = strcmp(name,"major");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DEVICE;
    }
    break;
  case FILE_DEVICE_MINOR:
    iVar2 = strcmp(name,"minor");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_DEVICE;
    }
    break;
  case FILE_DEVICENO:
    iVar2 = strcmp(name,"deviceno");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_INODE:
    iVar2 = strcmp(name,"inode");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_LINK:
    iVar2 = strcmp(name,"link");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_TYPE:
    iVar2 = strcmp(name,"type");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_NAME:
    iVar2 = strcmp(name,"name");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_ACL:
    iVar2 = strcmp(name,"acl");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_ACL_DEFAULT:
    iVar2 = strcmp(name,"default");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_ACL;
    }
    break;
  case FILE_ACL_ACCESS:
    iVar2 = strcmp(name,"access");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_ACL;
    }
    break;
  case FILE_ACL_APPLEEXTENDED:
    iVar2 = strcmp(name,"appleextended");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_ACL;
    }
    break;
  case FILE_FLAGS:
    iVar2 = strcmp(name,"flags");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_FLAGS_USER_NODUMP:
    iVar2 = strcmp(name,"UserNoDump");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_USER_IMMUTABLE:
    iVar2 = strcmp(name,"UserImmutable");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_USER_APPEND:
    iVar2 = strcmp(name,"UserAppend");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_USER_OPAQUE:
    iVar2 = strcmp(name,"UserOpaque");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_USER_NOUNLINK:
    iVar2 = strcmp(name,"UserNoUnlink");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_SYS_ARCHIVED:
    iVar2 = strcmp(name,"SystemArchived");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_SYS_IMMUTABLE:
    iVar2 = strcmp(name,"SystemImmutable");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_SYS_APPEND:
    iVar2 = strcmp(name,"SystemAppend");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_SYS_NOUNLINK:
    iVar2 = strcmp(name,"SystemNoUnlink");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_FLAGS_SYS_SNAPSHOT:
    iVar2 = strcmp(name,"SystemSnapshot");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_FLAGS;
    }
    break;
  case FILE_EXT2:
    iVar2 = strcmp(name,"ext2");
    if (iVar2 == 0) {
      xar_00->xmlsts = TOC_FILE;
    }
    break;
  case FILE_EXT2_SecureDeletion:
    iVar2 = strcmp(name,"SecureDeletion");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_Undelete:
    iVar2 = strcmp(name,"Undelete");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_Compress:
    iVar2 = strcmp(name,"Compress");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_Synchronous:
    iVar2 = strcmp(name,"Synchronous");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_Immutable:
    iVar2 = strcmp(name,"Immutable");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_AppendOnly:
    iVar2 = strcmp(name,"AppendOnly");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_NoDump:
    iVar2 = strcmp(name,"NoDump");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_NoAtime:
    iVar2 = strcmp(name,"NoAtime");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_CompDirty:
    iVar2 = strcmp(name,"CompDirty");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_CompBlock:
    iVar2 = strcmp(name,"CompBlock");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_NoCompBlock:
    iVar2 = strcmp(name,"NoCompBlock");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_CompError:
    iVar2 = strcmp(name,"CompError");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_BTree:
    iVar2 = strcmp(name,"BTree");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_HashIndexed:
    iVar2 = strcmp(name,"HashIndexed");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_iMagic:
    iVar2 = strcmp(name,"iMagic");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_Journaled:
    iVar2 = strcmp(name,"Journaled");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_NoTail:
    iVar2 = strcmp(name,"NoTail");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_DirSync:
    iVar2 = strcmp(name,"DirSync");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_TopDir:
    iVar2 = strcmp(name,"TopDir");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case FILE_EXT2_Reserved:
    iVar2 = strcmp(name,"Reserved");
    if (iVar2 == 0) {
      xar_00->xmlsts = FILE_EXT2;
    }
    break;
  case UNKNOWN:
    unknowntag_end(xar_00,name);
  }
  return;
}

Assistant:

static void
xml_end(void *userData, const char *name)
{
	struct archive_read *a;
	struct xar *xar;

	a = (struct archive_read *)userData;
	xar = (struct xar *)(a->format->data);

#if DEBUG
	fprintf(stderr, "xml_end:[%s]\n", name);
#endif
	switch (xar->xmlsts) {
	case INIT:
		break;
	case XAR:
		if (strcmp(name, "xar") == 0)
			xar->xmlsts = INIT;
		break;
	case TOC:
		if (strcmp(name, "toc") == 0)
			xar->xmlsts = XAR;
		break;
	case TOC_CREATION_TIME:
		if (strcmp(name, "creation-time") == 0)
			xar->xmlsts = TOC;
		break;
	case TOC_CHECKSUM:
		if (strcmp(name, "checksum") == 0)
			xar->xmlsts = TOC;
		break;
	case TOC_CHECKSUM_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = TOC_CHECKSUM;
		break;
	case TOC_CHECKSUM_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = TOC_CHECKSUM;
		break;
	case TOC_FILE:
		if (strcmp(name, "file") == 0) {
			if (xar->file->parent != NULL &&
			    ((xar->file->mode & AE_IFMT) == AE_IFDIR))
				xar->file->parent->subdirs++;
			xar->file = xar->file->parent;
			if (xar->file == NULL)
				xar->xmlsts = TOC;
		}
		break;
	case FILE_DATA:
		if (strcmp(name, "data") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DATA_LENGTH:
		if (strcmp(name, "length") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_ENCODING:
		if (strcmp(name, "encoding") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_A_CHECKSUM:
		if (strcmp(name, "archived-checksum") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_E_CHECKSUM:
		if (strcmp(name, "extracted-checksum") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_DATA_CONTENT:
		if (strcmp(name, "content") == 0)
			xar->xmlsts = FILE_DATA;
		break;
	case FILE_EA:
		if (strcmp(name, "ea") == 0) {
			xar->xmlsts = TOC_FILE;
			xar->xattr = NULL;
		}
		break;
	case FILE_EA_LENGTH:
		if (strcmp(name, "length") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_OFFSET:
		if (strcmp(name, "offset") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_SIZE:
		if (strcmp(name, "size") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_ENCODING:
		if (strcmp(name, "encoding") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_A_CHECKSUM:
		if (strcmp(name, "archived-checksum") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_E_CHECKSUM:
		if (strcmp(name, "extracted-checksum") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_NAME:
		if (strcmp(name, "name") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_EA_FSTYPE:
		if (strcmp(name, "fstype") == 0)
			xar->xmlsts = FILE_EA;
		break;
	case FILE_CTIME:
		if (strcmp(name, "ctime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_MTIME:
		if (strcmp(name, "mtime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ATIME:
		if (strcmp(name, "atime") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_GROUP:
		if (strcmp(name, "group") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_GID:
		if (strcmp(name, "gid") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_USER:
		if (strcmp(name, "user") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_UID:
		if (strcmp(name, "uid") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_MODE:
		if (strcmp(name, "mode") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DEVICE:
		if (strcmp(name, "device") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_DEVICE_MAJOR:
		if (strcmp(name, "major") == 0)
			xar->xmlsts = FILE_DEVICE;
		break;
	case FILE_DEVICE_MINOR:
		if (strcmp(name, "minor") == 0)
			xar->xmlsts = FILE_DEVICE;
		break;
	case FILE_DEVICENO:
		if (strcmp(name, "deviceno") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_INODE:
		if (strcmp(name, "inode") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_LINK:
		if (strcmp(name, "link") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_TYPE:
		if (strcmp(name, "type") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_NAME:
		if (strcmp(name, "name") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ACL:
		if (strcmp(name, "acl") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_ACL_DEFAULT:
		if (strcmp(name, "default") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_ACL_ACCESS:
		if (strcmp(name, "access") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_ACL_APPLEEXTENDED:
		if (strcmp(name, "appleextended") == 0)
			xar->xmlsts = FILE_ACL;
		break;
	case FILE_FLAGS:
		if (strcmp(name, "flags") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_FLAGS_USER_NODUMP:
		if (strcmp(name, "UserNoDump") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_IMMUTABLE:
		if (strcmp(name, "UserImmutable") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_APPEND:
		if (strcmp(name, "UserAppend") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_OPAQUE:
		if (strcmp(name, "UserOpaque") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_USER_NOUNLINK:
		if (strcmp(name, "UserNoUnlink") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_ARCHIVED:
		if (strcmp(name, "SystemArchived") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_IMMUTABLE:
		if (strcmp(name, "SystemImmutable") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_APPEND:
		if (strcmp(name, "SystemAppend") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_NOUNLINK:
		if (strcmp(name, "SystemNoUnlink") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_FLAGS_SYS_SNAPSHOT:
		if (strcmp(name, "SystemSnapshot") == 0)
			xar->xmlsts = FILE_FLAGS;
		break;
	case FILE_EXT2:
		if (strcmp(name, "ext2") == 0)
			xar->xmlsts = TOC_FILE;
		break;
	case FILE_EXT2_SecureDeletion:
		if (strcmp(name, "SecureDeletion") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Undelete:
		if (strcmp(name, "Undelete") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Compress:
		if (strcmp(name, "Compress") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Synchronous:
		if (strcmp(name, "Synchronous") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Immutable:
		if (strcmp(name, "Immutable") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_AppendOnly:
		if (strcmp(name, "AppendOnly") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoDump:
		if (strcmp(name, "NoDump") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoAtime:
		if (strcmp(name, "NoAtime") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompDirty:
		if (strcmp(name, "CompDirty") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompBlock:
		if (strcmp(name, "CompBlock") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoCompBlock:
		if (strcmp(name, "NoCompBlock") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_CompError:
		if (strcmp(name, "CompError") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_BTree:
		if (strcmp(name, "BTree") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_HashIndexed:
		if (strcmp(name, "HashIndexed") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_iMagic:
		if (strcmp(name, "iMagic") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Journaled:
		if (strcmp(name, "Journaled") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_NoTail:
		if (strcmp(name, "NoTail") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_DirSync:
		if (strcmp(name, "DirSync") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_TopDir:
		if (strcmp(name, "TopDir") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case FILE_EXT2_Reserved:
		if (strcmp(name, "Reserved") == 0)
			xar->xmlsts = FILE_EXT2;
		break;
	case UNKNOWN:
		unknowntag_end(xar, name);
		break;
	}
}